

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid)

{
  short sVar1;
  QLocaleId localeId_00;
  QLocaleId localeId_01;
  QLocaleId localeId_02;
  QLocaleId localeId_03;
  QLocaleId localeId_04;
  bool bVar2;
  QLocaleId QVar3;
  ulong uVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qsizetype index;
  ushort fallback;
  QLocaleId likelyId;
  QLocaleId localeId;
  QVarLengthArray<QLocaleId,_6LL> tried;
  QLocaleId *in_stack_fffffffffffffef8;
  QVarLengthArray<QLocaleId,_6LL> *in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1a;
  QVLABase<QLocaleId> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined2 in_stack_ffffffffffffff36;
  ushort local_5c;
  short local_4e;
  short sStack_4c;
  QVarLengthArray<QLocaleId,_6LL> local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (short)((ulong)in_RDI >> 0x20);
  QVar3 = QLocaleId::withLikelySubtagsAdded
                    ((QLocaleId *)
                     CONCAT26(in_stack_ffffffffffffff36,
                              CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)));
  local_5c = QVar3.language_id;
  QVar3.territory_id = local_5c;
  QVar3.language_id = (short)in_stack_ffffffffffffff1a;
  QVar3.script_id = (short)((uint)in_stack_ffffffffffffff1a >> 0x10);
  uVar4 = findLocaleIndexById(QVar3);
  if (-1 < (long)uVar4) goto LAB_00147b96;
  memset(&local_48,0xaa,0x40);
  QVarLengthArray<QLocaleId,_6LL>::QVarLengthArray(&local_48);
  QVarLengthArray<QLocaleId,_6LL>::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  bVar2 = QVLABase<QLocaleId>::contains<QLocaleId>
                    (in_stack_ffffffffffffff20,
                     (QLocaleId *)
                     CONCAT26(local_5c,CONCAT42(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18)
                             ));
  if (bVar2) {
LAB_001477ea:
    local_4e = (short)in_RDI;
    sStack_4c = (short)((ulong)in_RDI >> 0x10);
    if ((sVar1 != 0) && ((local_4e != 0 || (sStack_4c != 0)))) {
      QLocaleId::withLikelySubtagsAdded
                ((QLocaleId *)
                 CONCAT26(in_stack_ffffffffffffff36,
                          CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)));
      bVar2 = QVLABase<QLocaleId>::contains<QLocaleId>
                        (in_stack_ffffffffffffff20,
                         (QLocaleId *)
                         CONCAT26(local_5c,CONCAT42(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)));
      if (!bVar2) {
        localeId_01.territory_id = local_5c;
        localeId_01.language_id = (short)in_stack_ffffffffffffff1a;
        localeId_01.script_id = (short)((uint)in_stack_ffffffffffffff1a >> 0x10);
        uVar4 = findLocaleIndexById(localeId_01);
        if (-1 < (long)uVar4) goto LAB_00147b89;
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      bVar2 = QVLABase<QLocaleId>::contains<QLocaleId>
                        (in_stack_ffffffffffffff20,
                         (QLocaleId *)
                         CONCAT26(local_5c,CONCAT42(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)));
      if (!bVar2) {
        localeId_02.territory_id = local_5c;
        localeId_02.language_id = (short)in_stack_ffffffffffffff1a;
        localeId_02.script_id = (short)((uint)in_stack_ffffffffffffff1a >> 0x10);
        uVar4 = findLocaleIndexById(localeId_02);
        if (-1 < (long)uVar4) goto LAB_00147b89;
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
    }
    if ((sStack_4c != 0) && ((local_4e != 0 || (sVar1 != 0)))) {
      QLocaleId::withLikelySubtagsAdded
                ((QLocaleId *)
                 CONCAT26(in_stack_ffffffffffffff36,
                          CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)));
      bVar2 = QVLABase<QLocaleId>::contains<QLocaleId>
                        (in_stack_ffffffffffffff20,
                         (QLocaleId *)
                         CONCAT26(local_5c,CONCAT42(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)));
      if (!bVar2) {
        localeId_03.territory_id = local_5c;
        localeId_03.language_id = (short)in_stack_ffffffffffffff1a;
        localeId_03.script_id = (short)((uint)in_stack_ffffffffffffff1a >> 0x10);
        uVar4 = findLocaleIndexById(localeId_03);
        if (-1 < (long)uVar4) goto LAB_00147b89;
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
      bVar2 = QVLABase<QLocaleId>::contains<QLocaleId>
                        (in_stack_ffffffffffffff20,
                         (QLocaleId *)
                         CONCAT26(local_5c,CONCAT42(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)));
      if (!bVar2) {
        localeId_04.territory_id = local_5c;
        localeId_04.language_id = (short)in_stack_ffffffffffffff1a;
        localeId_04.script_id = (short)((uint)in_stack_ffffffffffffff1a >> 0x10);
        uVar4 = findLocaleIndexById(localeId_04);
        if (-1 < (long)uVar4) goto LAB_00147b89;
        QVarLengthArray<QLocaleId,_6LL>::push_back
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      }
    }
    uVar4 = (ulong)locale_index[local_5c];
  }
  else {
    localeId_00.territory_id = local_5c;
    localeId_00.language_id = (short)in_stack_ffffffffffffff1a;
    localeId_00.script_id = (short)((uint)in_stack_ffffffffffffff1a >> 0x10);
    uVar4 = findLocaleIndexById(localeId_00);
    if ((long)uVar4 < 0) {
      QVarLengthArray<QLocaleId,_6LL>::push_back
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      goto LAB_001477ea;
    }
  }
LAB_00147b89:
  QVarLengthArray<QLocaleId,_6LL>::~QVarLengthArray(in_stack_ffffffffffffff00);
LAB_00147b96:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

qsizetype QLocaleData::findLocaleIndex(QLocaleId lid) noexcept
{
    QLocaleId localeId = lid;
    QLocaleId likelyId = localeId.withLikelySubtagsAdded();
    const ushort fallback = likelyId.language_id;

    // Try a straight match with the likely data:
    qsizetype index = findLocaleIndexById(likelyId);
    if (index >= 0)
        return index;
    QVarLengthArray<QLocaleId, 6> tried;
    tried.push_back(likelyId);

#define CheckCandidate(id) do { \
        if (!tried.contains(id)) { \
            index = findLocaleIndexById(id); \
            if (index >= 0) \
                return index; \
            tried.push_back(id); \
        } \
    } while (false) // end CheckCandidate

    // No match; try again with raw data:
    CheckCandidate(localeId);

    // No match; try again with likely country for language_script
    if (lid.territory_id && (lid.language_id || lid.script_id)) {
        localeId.territory_id = 0;
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any country
        CheckCandidate(localeId);
    }

    // No match; try again with likely script for language_region
    if (lid.script_id && (lid.language_id || lid.territory_id)) {
        localeId = QLocaleId { lid.language_id, 0, lid.territory_id };
        likelyId = localeId.withLikelySubtagsAdded();
        CheckCandidate(likelyId);

        // No match; try again with any script
        CheckCandidate(localeId);
    }
#undef CheckCandidate

    // No match; return base index for initial likely language:
    return locale_index[fallback];
}